

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O3

int Abc_NtkRemoveDupFanins(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pNode;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  long lVar4;
  
  if ((pNtk->ntkFunc == ABC_FUNC_BDD) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    pVVar2 = pNtk->vObjs;
    if (pVVar2->nSize < 1) {
      iVar3 = 0;
    }
    else {
      lVar4 = 0;
      iVar3 = 0;
      do {
        pNode = (Abc_Obj_t *)pVVar2->pArray[lVar4];
        if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
          iVar3 = iVar3 + -1;
          do {
            iVar1 = Abc_NodeRemoveDupFanins_int(pNode);
            iVar3 = iVar3 + 1;
          } while (iVar1 != 0);
          pVVar2 = pNtk->vObjs;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pVVar2->nSize);
    }
    return iVar3;
  }
  __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                ,0x7d,"int Abc_NtkRemoveDupFanins(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkRemoveDupFanins( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, Counter;
    assert( Abc_NtkIsBddLogic(pNtk) );
    Counter = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        Counter += Abc_NodeRemoveDupFanins( pNode );
    return Counter;
}